

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

void __thiscall r_exec::GMonitor::update(GMonitor *this,uint64_t *next_target)

{
  MDLController *pMVar1;
  int iVar2;
  uint64_t uVar3;
  
  iVar2 = (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xe])();
  if ((char)iVar2 == '\0') {
    if ((this->super__GMonitor).simulating == 0) {
      pMVar1 = (this->super__GMonitor).super_Monitor.controller;
      uVar3 = 0;
      (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [0xf])(pMVar1,(this->super__GMonitor).super_Monitor.target.object,0,0);
      PMDLController::remove_g_monitor
                ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
                 &this->super__GMonitor);
    }
    else {
      (this->super__GMonitor).simulating = 0;
      commit(this);
      uVar3 = (this->super__GMonitor).deadline;
    }
  }
  else {
    PMDLController::remove_g_monitor
              ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
               &this->super__GMonitor);
    uVar3 = 0;
  }
  *next_target = uVar3;
  return;
}

Assistant:

void GMonitor::update(uint64_t &next_target)   // executed by a time core.
{
    if (target->is_invalidated()) {
        ((PMDLController *)controller)->remove_g_monitor(this);
        next_target = 0;
    } else if (simulating) {
        simulating = 0;
        commit();
        next_target = deadline;
    } else {
        ((PMDLController *)controller)->register_goal_outcome(target, false, nullptr);
        ((PMDLController *)controller)->remove_g_monitor(this);
        next_target = 0;
    }
}